

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  pointer ppTVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer ppTVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar12;
  uint uVar13;
  ulong uVar14;
  pointer ppEVar15;
  long lVar16;
  TestEventRepeater *pTVar17;
  undefined1 local_48 [8];
  timeval now;
  
  if (DAT_0014c660 == g_argvs_abi_cxx11_) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      iVar6 = FilterTests(this,(uint)!bVar4);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar8 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar8 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
            iVar8 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8) >> 7) -
                    (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),0xc) >> 0x1f)) +
                    local_48._0_4_ * 1000;
          }
          iVar8 = (iVar8 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar8;
        pTVar17 = (this->listeners_).repeater_;
        gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
        this->start_timestamp_ = now.tv_sec / 1000 + CONCAT44(local_48._4_4_,local_48._0_4_) * 1000;
        (*(pTVar17->super_TestEventListener)._vptr_TestEventListener[2])(pTVar17);
        uVar9 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar9 = FLAGS_gtest_repeat;
        }
        if (uVar9 == 0) {
          bVar5 = true;
        }
        else {
          uVar14 = 0;
          bVar11 = 0;
          now.tv_usec = (__suseconds_t)pTVar17;
          do {
            ppTVar2 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppTVar7 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar7 != ppTVar2;
                ppTVar7 = ppTVar7 + 1) {
              TestCase::ClearResult(*ppTVar7);
            }
            gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
            pTVar17 = (TestEventRepeater *)now.tv_usec;
            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(now.tv_sec),8);
            lVar3 = CONCAT44(local_48._4_4_,local_48._0_4_);
            if (iVar6 < 1) {
              (**(code **)(*(long *)now.tv_usec + 0x18))(now.tv_usec,this->parent_,uVar14);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (**(code **)(*(long *)pTVar17 + 0x18))(pTVar17,this->parent_,uVar14);
              (**(code **)(*(long *)pTVar17 + 0x20))(pTVar17,this->parent_);
              ppEVar12 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar15 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar15 != ppEVar12;
                  ppEVar15 = ppEVar15 + 1) {
                (**(code **)(*(long *)*ppEVar15 + 0x10))();
              }
              (**(code **)(*(long *)now.tv_usec + 0x28))(now.tv_usec,this->parent_);
              bVar5 = Test::HasFatalFailure();
              if ((!bVar5) &&
                 (ppTVar7 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7)
                          >> 3))) {
                lVar16 = 0;
                do {
                  TestCase::Run(ppTVar7[(uint)(this->test_case_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar16]]);
                  lVar16 = lVar16 + 1;
                  ppTVar7 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar16 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar7) >> 3));
              }
              (**(code **)(*(long *)now.tv_usec + 0x58))(now.tv_usec,this->parent_);
              ppEVar15 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar12 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar17 = (TestEventRepeater *)now.tv_usec, ppEVar12 != ppEVar15;
                  ppEVar12 = ppEVar12 + -1) {
                (**(code **)(*(long *)ppEVar12[-1] + 0x18))();
              }
              (**(code **)(*(long *)now.tv_usec + 0x60))(now.tv_usec);
            }
            gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_48._4_4_,local_48._0_4_) - lVar3) * 1000 +
                 now.tv_sec / 1000 + ((lVar10 >> 7) - (lVar10 >> 0x3f));
            (*(pTVar17->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar17,this->parent_,uVar14);
            bVar5 = Passed(this);
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar8 = GetNextRandomSeed(this->random_seed_);
              this->random_seed_ = iVar8;
            }
            bVar11 = bVar11 | !bVar5;
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
          } while (uVar13 != uVar9 || (int)uVar9 < 0);
          bVar5 = (bool)(bVar11 ^ 1);
        }
        (*(pTVar17->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar17,this->parent_);
      }
    }
  }
  return bVar5;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // Makes sure InitGoogleTest() was called.
  if (!GTestIsInitialized()) {
    printf("%s",
           "\nThis test program did NOT call ::testing::InitGoogleTest "
           "before calling RUN_ALL_TESTS().  Please fix it.\n");
    return false;
  }

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  return !failed;
}